

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deAppendList.hpp
# Opt level: O0

void __thiscall
de::AppendList<vk::DebugReportMessage>::AppendList
          (AppendList<vk::DebugReportMessage> *this,size_t blockSize)

{
  Block *this_00;
  size_t blockSize_local;
  AppendList<vk::DebugReportMessage> *this_local;
  
  this->m_blockSize = blockSize;
  this->m_numElements = 0;
  this_00 = (Block *)operator_new(0x18);
  Block::Block(this_00,0,blockSize);
  this->m_first = this_00;
  this->m_last = this->m_first;
  return;
}

Assistant:

AppendList<ElementType>::AppendList (size_t blockSize)
	: m_blockSize	(blockSize)
	, m_numElements	(0)
	, m_first		(new Block(0, blockSize))
	, m_last		(m_first)
{
}